

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O3

void __thiscall Ptex::v2_2::PtexReaderCache::processMru(PtexReaderCache *this)

{
  PtexLruList<Ptex::v2_2::PtexCachedReader,_&Ptex::v2_2::PtexCachedReader::_activeFilesItem> *pPVar1
  ;
  PtexLruItem *pPVar2;
  size_t *psVar3;
  MruList *pMVar4;
  size_t sVar5;
  PtexCachedReader *pPVar6;
  size_t sVar7;
  PtexLruItem *pPVar8;
  PtexLruItem *pPVar9;
  bool bVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  size_t sVar15;
  size_t sVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  
  iVar11 = pthread_mutex_trylock((pthread_mutex_t *)&this->_mruLock);
  if (iVar11 != 0) {
    return;
  }
  if (0x31 < this->_mruList->next) {
    pMVar4 = this->_mruList;
    this->_mruList = this->_prevMruList;
    this->_prevMruList = pMVar4;
    sVar5 = this->_maxMem;
    pPVar1 = &this->_activeFiles;
    sVar15 = this->_fileOpens;
    sVar16 = this->_blockReads;
    lVar17 = 0;
    lVar14 = 0;
    lVar12 = 0;
    do {
      do {
        pPVar6 = pMVar4->files[lVar17];
      } while (pPVar6 == (PtexCachedReader *)0x0);
      pMVar4->files[lVar17] = (PtexCachedReader *)0x0;
      sVar7 = (pPVar6->super_PtexReader)._memUsed;
      lVar14 = (lVar14 + sVar7) - pPVar6->_memUsedAccountedFor;
      pPVar6->_memUsedAccountedFor = sVar7;
      sVar7 = (pPVar6->super_PtexReader)._opens;
      lVar18 = sVar7 - pPVar6->_opensAccountedFor;
      pPVar6->_opensAccountedFor = sVar7;
      sVar7 = (pPVar6->super_PtexReader)._blockReads;
      lVar19 = sVar7 - pPVar6->_blockReadsAccountedFor;
      pPVar6->_blockReadsAccountedFor = sVar7;
      if (lVar19 != 0 || lVar18 != 0) {
        sVar15 = sVar15 + lVar18;
        this->_fileOpens = sVar15;
        sVar16 = sVar16 + lVar19;
        this->_blockReads = sVar16;
        pPVar2 = &pPVar6->_openFilesItem;
        pPVar8 = (pPVar6->_openFilesItem)._prev;
        pPVar9 = (pPVar6->_openFilesItem)._next;
        pPVar9->_prev = pPVar8;
        pPVar8->_next = pPVar9;
        (pPVar6->_openFilesItem)._prev = pPVar2;
        pPVar8 = (this->_openFiles)._end._prev;
        pPVar8->_next = pPVar2;
        (pPVar6->_openFilesItem)._next = &(this->_openFiles)._end;
        (pPVar6->_openFilesItem)._prev = pPVar8;
        (this->_openFiles)._end._prev = pPVar2;
      }
      if (sVar5 != 0) {
        pPVar2 = &pPVar6->_activeFilesItem;
        pPVar8 = (pPVar6->_activeFilesItem)._prev;
        pPVar9 = (pPVar6->_activeFilesItem)._next;
        pPVar9->_prev = pPVar8;
        pPVar8->_next = pPVar9;
        (pPVar6->_activeFilesItem)._prev = pPVar2;
        pPVar8 = (pPVar1->_end)._prev;
        pPVar8->_next = pPVar2;
        (pPVar6->_activeFilesItem)._next = &pPVar1->_end;
        (pPVar6->_activeFilesItem)._prev = pPVar8;
        (pPVar1->_end)._prev = pPVar2;
      }
      lVar12 = lVar12 + lVar18;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0x32);
    pMVar4->next = 0;
    if (lVar14 != 0) {
      LOCK();
      psVar3 = &this->_memUsed;
      sVar5 = *psVar3;
      *psVar3 = *psVar3 + lVar14;
      UNLOCK();
      uVar13 = sVar5 + lVar14;
      if (sVar5 + lVar14 < this->_peakMemUsed) {
        uVar13 = this->_peakMemUsed;
      }
      this->_peakMemUsed = uVar13;
    }
    if (lVar12 != 0) {
      LOCK();
      psVar3 = &this->_filesOpen;
      sVar5 = *psVar3;
      *psVar3 = *psVar3 + lVar12;
      UNLOCK();
      uVar13 = sVar5 + lVar12;
      if (sVar5 + lVar12 < this->_peakFilesOpen) {
        uVar13 = this->_peakFilesOpen;
      }
      this->_peakFilesOpen = uVar13;
    }
    if (this->_maxMem == 0) {
      bVar10 = false;
    }
    else {
      bVar10 = this->_maxMem < this->_memUsed;
    }
    if (this->_maxFiles < this->_filesOpen) {
      pruneFiles(this);
    }
    if (bVar10) {
      pruneData(this);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mruLock);
  return;
}

Assistant:

void PtexReaderCache::processMru()
{
    // use a non-blocking lock so we can proceed as soon as space has been freed in the mru list
    // (which happens almost immediately in the processMru thread that has the lock)
    if (!_mruLock.trylock()) return;
    if (_mruList->next < numMruFiles) {
        _mruLock.unlock();
        return;
    }

    // switch mru buffers and reset slot counter so other threads can proceed immediately
    MruList* mruList = _mruList;
    AtomicStore(&_mruList, _prevMruList);
    _prevMruList = mruList;

    // extract relevant stats and add to open/active list
    size_t memUsedChange = 0, filesOpenChange = 0;
    for (int i = 0; i < numMruFiles; ++i) {
        PtexCachedReader* reader;
        do { reader = mruList->files[i]; } while (!reader); // loop on (unlikely) race condition
        mruList->files[i] = 0;
        memUsedChange += reader->getMemUsedChange();
        size_t opens = reader->getOpensChange();
        size_t blockReads = reader->getBlockReadsChange();
        filesOpenChange += opens;
        if (opens || blockReads) {
            _fileOpens += opens;
            _blockReads += blockReads;
            _openFiles.push(reader);
        }
        if (_maxMem) {
            _activeFiles.push(reader);
        }
    }
    AtomicStore(&mruList->next, 0);
    adjustMemUsed(memUsedChange);
    adjustFilesOpen(filesOpenChange);

    bool shouldPruneFiles = _filesOpen > _maxFiles;
    bool shouldPruneData = _maxMem && _memUsed > _maxMem;

    if (shouldPruneFiles) {
        pruneFiles();
    }
    if (shouldPruneData) {
        pruneData();
    }
    _mruLock.unlock();
}